

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zetMetricProgrammableGetPropertiesExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_exp_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010e738 != (code *)0x0) {
    zVar1 = (*DAT_0010e738)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricProgrammableGetPropertiesExp(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_exp_properties_t* pProperties   ///< [in,out] properties of the metric programmable
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetPropertiesExp = context.zetDdiTable.MetricProgrammableExp.pfnGetPropertiesExp;
        if( nullptr != pfnGetPropertiesExp )
        {
            result = pfnGetPropertiesExp( hMetricProgrammable, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }